

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O1

function<void_(const_int_&)> * __thiscall
QtPromisePrivate::PromiseHandler<int,std::function<void(int_const&)>,int_const&>::
create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
          (function<void_(const_int_&)> *__return_storage_ptr__,
          PromiseHandler<int,std::function<void(int_const&)>,int_const&> *this,
          function<void_(const_int_&)> *handler,QPromiseResolve<void> *resolve,
          QPromiseReject<void> *reject)

{
  function<void_(const_int_&)> *this_00;
  anon_class_48_3_a63a5800 local_48;
  
  local_48.resolve.m_resolver.m_d.d =
       *(PromiseResolver<void> *)&(handler->super__Function_base)._M_functor;
  if (local_48.resolve.m_resolver.m_d.d !=
      (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)0x0) {
    LOCK();
    (((Data *)local_48.resolve.m_resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_48.resolve.m_resolver.m_d.d)->super_QSharedData).ref.
         super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>.
         _M_i + 1;
    UNLOCK();
  }
  local_48.reject.m_resolver.m_d.d = (PromiseResolver<void>)(resolve->m_resolver).m_d.d;
  if (local_48.reject.m_resolver.m_d.d !=
      (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)0x0) {
    LOCK();
    (((Data *)local_48.reject.m_resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value =
         (Type)((int)(((Data *)local_48.reject.m_resolver.m_d.d)->super_QSharedData).ref.
                     super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  this_00 = &local_48.handler;
  std::function<void_(const_int_&)>::function(this_00,(function<void_(const_int_&)> *)this);
  std::function<void(int_const&)>::
  function<QtPromisePrivate::PromiseHandler<int,std::function<void(int_const&)>,int_const&>::create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(std::function<void(int_const&)>const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)::_lambda(int_const&)_1_,void>
            ((function<void(int_const&)> *)__return_storage_ptr__,&local_48);
  if (local_48.handler.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_48.handler.super__Function_base._M_manager)
              ((_Any_data *)this_00,(_Any_data *)this_00,__destroy_functor);
  }
  if (local_48.reject.m_resolver.m_d.d !=
      (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)0x0) {
    LOCK();
    (((QSharedData *)local_48.reject.m_resolver.m_d.d)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value =
         (Type)((int)(((QSharedData *)local_48.reject.m_resolver.m_d.d)->ref).
                     super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value + -1);
    UNLOCK();
    if (((__atomic_base<int>)
         *(__int_type *)
          &(((QSharedData *)local_48.reject.m_resolver.m_d.d)->ref).super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) &&
       (local_48.reject.m_resolver.m_d.d !=
        (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)0x0)) {
      operator_delete((void *)local_48.reject.m_resolver.m_d.d,0x10);
    }
  }
  if (local_48.resolve.m_resolver.m_d.d !=
      (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)0x0) {
    LOCK();
    *(int *)local_48.resolve.m_resolver.m_d.d = *(int *)local_48.resolve.m_resolver.m_d.d + -1;
    UNLOCK();
    if ((*(int *)local_48.resolve.m_resolver.m_d.d == 0) &&
       (local_48.resolve.m_resolver.m_d.d !=
        (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)0x0)) {
      operator_delete((void *)local_48.resolve.m_resolver.m_d.d,0x10);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::function<void(const T&)>
    create(const THandler& handler, const TResolve& resolve, const TReject& reject)
    {
        return [=](const T& value) {
            PromiseDispatch<ResType>::call(resolve, reject, handler, value);
        };
    }